

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseSignalPrefix(Ver_Man_t *pMan,char **ppWord,int *pnMsb,int *pnLsb)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *__nptr;
  
  if (**ppWord != '[') {
    __assert_fail("pWord[0] == \'[\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x27f,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
  }
  __nptr = *ppWord + 1;
  iVar2 = atoi(__nptr);
  cVar1 = '[';
  while (cVar1 != '\0') {
    if (cVar1 == ':') {
      iVar3 = atoi(__nptr);
      cVar1 = ':';
      goto LAB_002f4e1b;
    }
    if (cVar1 == ']') {
      __nptr = __nptr + -1;
      iVar3 = iVar2;
      goto LAB_002f4df4;
    }
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  }
LAB_002f4e30:
  builtin_strncpy(pMan->sError,"Cannot find closing bracket in this line.",0x2a);
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
LAB_002f4e1b:
  if (cVar1 == '\0') goto LAB_002f4e30;
  if (cVar1 == ']') {
    if (*__nptr != '\\') goto LAB_002f4df4;
    __nptr = __nptr + 1;
    pcVar4 = __nptr;
    goto LAB_002f4e7a;
  }
  cVar1 = *__nptr;
  __nptr = __nptr + 1;
  goto LAB_002f4e1b;
LAB_002f4e7a:
  if (*pcVar4 == '\0') {
LAB_002f4df4:
    if ((-1 < iVar2) && (-1 < iVar3)) {
      *ppWord = __nptr;
      *pnMsb = iVar2;
      *pnLsb = iVar3;
      return 1;
    }
    __assert_fail("nMsb >= 0 && nLsb >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                  ,0x2a8,"int Ver_ParseSignalPrefix(Ver_Man_t *, char **, int *, int *)");
  }
  if (*pcVar4 == ' ') {
    *pcVar4 = '\0';
    goto LAB_002f4df4;
  }
  pcVar4 = pcVar4 + 1;
  goto LAB_002f4e7a;
}

Assistant:

int Ver_ParseSignalPrefix( Ver_Man_t * pMan, char ** ppWord, int * pnMsb, int * pnLsb )
{
    char * pWord = *ppWord, * pTemp;
    int nMsb, nLsb;
    assert( pWord[0] == '[' );
    // get the beginning
    nMsb = atoi( pWord + 1 );
    // find the splitter
    while ( *pWord && *pWord != ':' && *pWord != ']' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find closing bracket in this line." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    if ( *pWord == ']' )
        nLsb = nMsb;
    else
    {
        assert( *pWord == ':' );
        nLsb = atoi( pWord + 1 );
        // find the closing parenthesis
        while ( *pWord && *pWord != ']' )
            pWord++;
        if ( *pWord == 0 )
        {
            sprintf( pMan->sError, "Cannot find closing bracket in this line." );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        assert( *pWord == ']' );
        pWord++;

        // fix the case when \<name> follows after [] without space
        if ( *pWord == '\\' )
        {
            pWord++;
            pTemp = pWord;
            while ( *pTemp && *pTemp != ' ' )
                pTemp++;
            if ( *pTemp == ' ' )
                *pTemp = 0;
        }
    }
    assert( nMsb >= 0 && nLsb >= 0 );
    // return
    *ppWord = pWord;
    *pnMsb = nMsb;
    *pnLsb = nLsb;
    return 1;
}